

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack1to8.h
# Opt level: O3

void ncnn::conv1x1s2_sgemm_pack1to8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  uint _c;
  int _w;
  int _h;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  int iVar10;
  Mat local_78;
  
  iVar1 = bottom_blob->w;
  _c = bottom_blob->c;
  _w = top_blob->w;
  _h = top_blob->h;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,_w,_h,_c,bottom_blob->elemsize,bottom_blob->elempack,
              opt->workspace_allocator);
  if (0 < (int)_c) {
    pvVar2 = bottom_blob->data;
    sVar3 = bottom_blob->cstep;
    sVar4 = bottom_blob->elemsize;
    uVar7 = 0;
    do {
      if (0 < _h) {
        puVar8 = (undefined4 *)
                 (local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                  uVar7 + (long)local_78.data);
        puVar9 = (undefined4 *)(sVar3 * sVar4 * uVar7 + (long)pvVar2);
        iVar10 = 0;
        do {
          iVar6 = _w;
          if (0 < _w) {
            do {
              *puVar8 = *puVar9;
              puVar9 = puVar9 + 2;
              puVar8 = puVar8 + 1;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          puVar9 = puVar9 + (iVar1 - _w) * 2;
          iVar10 = iVar10 + 1;
        } while (iVar10 != _h);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != _c);
  }
  conv1x1s1_sgemm_pack1to8_avx(&local_78,top_blob,kernel,_bias,opt);
  piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack1to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                outptr[0] = r0[0];

                r0 += 2;
                outptr += 1;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack1to8_avx(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}